

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void glfwInitHint(int hint,int value)

{
  GLFWbool GVar1;
  int iVar2;
  int iVar3;
  GLFWbool GVar4;
  GLFWbool GVar5;
  anon_struct_4_1_6d51ede9_for_x11 aVar6;
  int value_local;
  int hint_local;
  
  GVar1 = value;
  iVar2 = _glfwInitHints.angleType;
  iVar3 = _glfwInitHints.platformID;
  GVar4 = _glfwInitHints.ns.menubar;
  GVar5 = _glfwInitHints.ns.chdir;
  aVar6.xcbVulkanSurface = _glfwInitHints.x11.xcbVulkanSurface;
  if ((((hint != 0x50001) && (GVar1 = _glfwInitHints.hatButtons, iVar2 = value, hint != 0x50002)) &&
      (iVar2 = _glfwInitHints.angleType, iVar3 = value, hint != 0x50003)) &&
     (((iVar3 = _glfwInitHints.platformID, GVar5 = value, hint != 0x51001 &&
       (GVar4 = value, GVar5 = _glfwInitHints.ns.chdir, hint != 0x51002)) &&
      (GVar4 = _glfwInitHints.ns.menubar, aVar6.xcbVulkanSurface = value, hint != 0x52001)))) {
    _glfwInputError(0x10003,"Invalid init hint 0x%08X",(ulong)(uint)hint);
    GVar1 = _glfwInitHints.hatButtons;
    iVar2 = _glfwInitHints.angleType;
    iVar3 = _glfwInitHints.platformID;
    GVar4 = _glfwInitHints.ns.menubar;
    GVar5 = _glfwInitHints.ns.chdir;
    aVar6 = _glfwInitHints.x11;
  }
  _glfwInitHints.x11.xcbVulkanSurface = aVar6.xcbVulkanSurface;
  _glfwInitHints.ns.chdir = GVar5;
  _glfwInitHints.ns.menubar = GVar4;
  _glfwInitHints.platformID = iVar3;
  _glfwInitHints.angleType = iVar2;
  _glfwInitHints.hatButtons = GVar1;
  return;
}

Assistant:

GLFWAPI void glfwInitHint(int hint, int value)
{
    switch (hint)
    {
        case GLFW_JOYSTICK_HAT_BUTTONS:
            _glfwInitHints.hatButtons = value;
            return;
        case GLFW_ANGLE_PLATFORM_TYPE:
            _glfwInitHints.angleType = value;
            return;
        case GLFW_PLATFORM:
            _glfwInitHints.platformID = value;
            return;
        case GLFW_COCOA_CHDIR_RESOURCES:
            _glfwInitHints.ns.chdir = value;
            return;
        case GLFW_COCOA_MENUBAR:
            _glfwInitHints.ns.menubar = value;
            return;
        case GLFW_X11_XCB_VULKAN_SURFACE:
            _glfwInitHints.x11.xcbVulkanSurface = value;
            return;
    }

    _glfwInputError(GLFW_INVALID_ENUM,
                    "Invalid init hint 0x%08X", hint);
}